

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  long lVar1;
  size_type sVar2;
  ostream *poVar3;
  StringRef str;
  StringRef str_00;
  string *rhs_local;
  string *lhs_local;
  ostream *os_local;
  StringRef op_local;
  
  lVar1 = std::__cxx11::string::size();
  sVar2 = std::__cxx11::string::size();
  if (((lVar1 + sVar2 < 0x28) && (lVar1 = std::__cxx11::string::find((char)os,10), lVar1 == -1)) &&
     (lVar1 = std::__cxx11::string::find((char)op.m_size,10), lVar1 == -1)) {
    poVar3 = std::operator<<((ostream *)this,(string *)os);
    poVar3 = std::operator<<(poVar3,' ');
    str.m_size = sVar2;
    str.m_start = op.m_start;
    poVar3 = operator<<((Catch *)poVar3,(ostream *)lhs,str);
    poVar3 = std::operator<<(poVar3,' ');
    std::operator<<(poVar3,(string *)op.m_size);
    return;
  }
  poVar3 = std::operator<<((ostream *)this,(string *)os);
  poVar3 = std::operator<<(poVar3,'\n');
  str_00.m_size = sVar2;
  str_00.m_start = op.m_start;
  poVar3 = operator<<((Catch *)poVar3,(ostream *)lhs,str_00);
  poVar3 = std::operator<<(poVar3,'\n');
  std::operator<<(poVar3,(string *)op.m_size);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << ' ' << op << ' ' << rhs;
        else
            os << lhs << '\n' << op << '\n' << rhs;
    }